

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_mtsafe_st_env_infrastructure.cpp
# Opt level: O1

timer_id_t __thiscall
so_5::env_infrastructures::simple_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
schedule_timer(env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
               *this,type_index *type_wrapper,message_ref_t *msg,mbox_t *mbox,duration pause,
              duration period)

{
  int iVar1;
  undefined8 in_stack_00000008;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(type_wrapper + 2));
  if (iVar1 == 0) {
    (**(code **)(*(long *)type_wrapper[0x24]._M_target + 0x20))
              (this,type_wrapper[0x24]._M_target,msg,pause.__r,mbox,period.__r,in_stack_00000008);
    if (*(int *)&type_wrapper[0xd]._M_target == 1) {
      std::condition_variable::notify_one();
    }
    pthread_mutex_unlock((pthread_mutex_t *)(type_wrapper + 2));
    return (timer_id_t)(intrusive_ptr_t<so_5::timer_t>)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

so_5::timer_id_t
env_infrastructure_t< ACTIVITY_TRACKER >::schedule_timer(
	const std::type_index & type_wrapper,
	const message_ref_t & msg,
	const mbox_t & mbox,
	std::chrono::steady_clock::duration pause,
	std::chrono::steady_clock::duration period )
	{
		std::lock_guard< std::mutex > lock( m_sync_objects.m_lock );

		auto timer = m_timer_manager->schedule(
				type_wrapper,
				mbox,
				msg,
				pause,
				period );

		wakeup_if_waiting( m_sync_objects );

		return timer;
	}